

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O2

void __thiscall LogStream::formatInteger<unsigned_long>(LogStream *this,unsigned_long v)

{
  char *buf;
  size_t sVar1;
  char **ppcVar2;
  
  buf = (this->buffer_).cur_;
  ppcVar2 = &(this->buffer_).cur_;
  if (0x1f < (int)ppcVar2 - (int)buf) {
    sVar1 = convert<unsigned_long>(buf,v);
    *ppcVar2 = *ppcVar2 + sVar1;
  }
  return;
}

Assistant:

void LogStream::formatInteger(T v) {
    if (buffer_.avail() >= kMaxNumericSize) {
        size_t len = convert(buffer_.current(), v);
        buffer_.add(len);
    }
}